

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O0

size_t webrtc::WriteFloatBufferToFile(FileWrapper *file,size_t length,float *buffer)

{
  float value;
  uint uVar1;
  uchar *__p;
  pointer puVar2;
  FileWrapper *local_38;
  size_t floats_written;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> byte_array;
  float *buffer_local;
  size_t length_local;
  FileWrapper *file_local;
  
  if ((((file == (FileWrapper *)0x0) ||
       (byte_array._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
        _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
             buffer, uVar1 = (*(file->super_InStream)._vptr_InStream[4])(), (uVar1 & 1) == 0)) ||
      ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
       byte_array._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
       _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl ==
       (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0)) || (length == 0)
     ) {
    file_local = (FileWrapper *)0x0;
  }
  else {
    __p = (uchar *)operator_new__(4);
    std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
    unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
              ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&floats_written,
               __p);
    for (local_38 = (FileWrapper *)0x0; local_38 < length;
        local_38 = (FileWrapper *)((long)&(local_38->super_InStream)._vptr_InStream + 1)) {
      value = *(float *)((long)byte_array._M_t.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                        (long)local_38 * 4);
      puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &floats_written);
      ConvertFloatToByteArray(value,puVar2);
      puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &floats_written);
      (**(file->super_OutStream)._vptr_OutStream)(&file->super_OutStream,puVar2,4);
    }
    (*(file->super_InStream)._vptr_InStream[9])();
    file_local = local_38;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&floats_written
              );
  }
  return (size_t)file_local;
}

Assistant:

size_t WriteFloatBufferToFile(FileWrapper* file,
                              size_t length,
                              const float* buffer) {
  if (!file || !file->Open() || !buffer || length <= 0) {
    return 0;
  }

  std::unique_ptr<uint8_t[]> byte_array(new uint8_t[4]);

  size_t floats_written = 0;

  for (floats_written = 0; floats_written < length; ++floats_written) {
    // Get byte representation.
    ConvertFloatToByteArray(buffer[floats_written], byte_array.get());

    file->Write(byte_array.get(), 4);
  }

  file->Flush();

  return floats_written;
}